

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O1

void __thiscall EditorInterface::showSaveDialog(EditorInterface *this,function<void_()> *action)

{
  element_type *peVar1;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *this_00;
  String *pSVar2;
  undefined8 uVar3;
  function<void_()> *__x;
  size_type sVar4;
  _Link_type p_Var5;
  undefined8 *puVar6;
  Vector2f *pVVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  float x;
  float y;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar8;
  shared_ptr<gui::DialogBox> saveDialog;
  shared_ptr<gui::Button> saveRefuseButton;
  shared_ptr<gui::Button> saveSubmitButton;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [32];
  code *local_88;
  String *local_78;
  undefined1 local_70 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _func_int **local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  function<void_()> *local_38;
  
  ::gui::Widget::sendToFront
            (&(((this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_Group).super_Container.super_Widget);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,1);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::locale::locale((locale *)&local_c8);
  sf::String::String((String *)local_a8,"saveDialog",(locale *)&local_c8);
  ::gui::ContainerBase::getChild<gui::DialogBox>
            ((ContainerBase *)local_70,(String *)peVar1,SUB81(local_a8,0));
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::locale::~locale((locale *)&local_c8);
  uVar3 = local_70._0_8_;
  std::locale::locale((locale *)&local_c8);
  sf::String::String((String *)local_a8,"saveSubmitButton",(locale *)&local_c8);
  ::gui::ContainerBase::getChild<gui::Button>
            ((ContainerBase *)&local_48,(String *)uVar3,SUB81(local_a8,0));
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::locale::~locale((locale *)&local_c8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
           *)(local_48 + 0x4b));
  local_78 = (String *)uVar3;
  local_a8._8_8_ = uVar3;
  local_a8._0_8_ = this;
  std::function<void_()>::function((function<void_()> *)(local_a8 + 0x10),action);
  this_00 = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             *)(local_48 + 0x4b);
  sVar4 = std::
          map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                   *)this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  while (sVar4 != 0) {
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    sVar4 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                     *)this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  }
  p_Var5 = (_Link_type)operator_new(0x50);
  *(int *)(p_Var5->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = (undefined8 *)0x0;
  uStack_c0 = 0;
  local_38 = action;
  puVar6 = (undefined8 *)operator_new(0x30);
  *puVar6 = local_a8._0_8_;
  puVar6[1] = local_a8._8_8_;
  local_70._16_8_ = this;
  std::function<void_()>::function
            ((function<void_()> *)(puVar6 + 2),(function<void_()> *)(local_a8 + 0x10));
  *(code **)((p_Var5->_M_storage)._M_storage + 0x20) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:201:39)>
       ::_M_invoke;
  (p_Var5->_M_storage)._M_storage[0x18] = '\0';
  (p_Var5->_M_storage)._M_storage[0x19] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1a] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1b] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1c] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1d] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1e] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1f] = '\0';
  *(undefined8 **)((p_Var5->_M_storage)._M_storage + 8) = puVar6;
  *(undefined8 *)((p_Var5->_M_storage)._M_storage + 0x10) = uStack_c0;
  *(code **)((p_Var5->_M_storage)._M_storage + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:201:39)>
       ::_M_manager;
  local_b8 = 0;
  uStack_b0 = 0;
  (p_Var5->_M_storage)._M_storage[0x28] = '\x01';
  (p_Var5->_M_storage)._M_storage[0x29] = '\0';
  (p_Var5->_M_storage)._M_storage[0x2a] = '\0';
  (p_Var5->_M_storage)._M_storage[0x2b] = '\0';
  local_c8 = puVar6;
  pVar8 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos(this_00,(key_type_conflict1 *)&p_Var5->_M_storage);
  __x = local_38;
  if (pVar8.second == (_Base_ptr)0x0) {
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::~Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((p_Var5->_M_storage)._M_storage + 8));
    operator_delete(p_Var5);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node(this_00,pVar8.first,pVar8.second,p_Var5);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  if (local_88 != (code *)0x0) {
    (*local_88)((_Any_data *)(local_a8 + 0x10),(_Any_data *)(local_a8 + 0x10),__destroy_functor);
  }
  uVar3 = local_70._0_8_;
  std::locale::locale((locale *)&local_c8);
  sf::String::String((String *)local_a8,"saveRefuseButton",(locale *)&local_c8);
  pSVar2 = local_78;
  ::gui::ContainerBase::getChild<gui::Button>
            ((ContainerBase *)(local_70 + 0x18),(String *)uVar3,SUB81(local_a8,0));
  if ((EditorInterface *)local_a8._0_8_ != (EditorInterface *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::locale::~locale((locale *)&local_c8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
           *)&(((pointer)(local_70._24_8_ + 0x250))->
              super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_a8._0_8_ = local_70._16_8_;
  local_a8._8_8_ = pSVar2;
  std::function<void_()>::function((function<void_()> *)(local_a8 + 0x10),__x);
  this_01 = &(((pointer)(local_70._24_8_ + 0x250))->
             super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  sVar4 = std::
          map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                   *)this_01,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  while (sVar4 != 0) {
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    sVar4 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                     *)this_01,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  }
  p_Var5 = (_Link_type)operator_new(0x50);
  *(int *)(p_Var5->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = (undefined8 *)0x0;
  uStack_c0 = 0;
  puVar6 = (undefined8 *)operator_new(0x30);
  *puVar6 = local_a8._0_8_;
  puVar6[1] = local_a8._8_8_;
  std::function<void_()>::function
            ((function<void_()> *)(puVar6 + 2),(function<void_()> *)(local_a8 + 0x10));
  *(code **)((p_Var5->_M_storage)._M_storage + 0x20) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:210:39)>
       ::_M_invoke;
  (p_Var5->_M_storage)._M_storage[0x18] = '\0';
  (p_Var5->_M_storage)._M_storage[0x19] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1a] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1b] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1c] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1d] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1e] = '\0';
  (p_Var5->_M_storage)._M_storage[0x1f] = '\0';
  *(undefined8 **)((p_Var5->_M_storage)._M_storage + 8) = puVar6;
  *(undefined8 *)((p_Var5->_M_storage)._M_storage + 0x10) = uStack_c0;
  *(code **)((p_Var5->_M_storage)._M_storage + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:210:39)>
       ::_M_manager;
  local_b8 = 0;
  uStack_b0 = 0;
  (p_Var5->_M_storage)._M_storage[0x28] = '\x01';
  (p_Var5->_M_storage)._M_storage[0x29] = '\0';
  (p_Var5->_M_storage)._M_storage[0x2a] = '\0';
  (p_Var5->_M_storage)._M_storage[0x2b] = '\0';
  local_c8 = puVar6;
  pVar8 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos
                    ((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                      *)this_01,(key_type_conflict1 *)&p_Var5->_M_storage);
  uVar3 = local_70._16_8_;
  if (pVar8.second == (_Base_ptr)0x0) {
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::~Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((p_Var5->_M_storage)._M_storage + 8));
    operator_delete(p_Var5);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                      *)this_01,pVar8.first,pVar8.second,p_Var5);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  if (local_88 != (code *)0x0) {
    (*local_88)((_Any_data *)(local_a8 + 0x10),(_Any_data *)(local_a8 + 0x10),__destroy_functor);
  }
  (**(code **)((((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_70._0_8_)->_M_dataplus)._M_p + 6))(local_70._0_8_,1);
  pVVar7 = ::gui::Panel::getSize
                     ((((shared_ptr<gui::Panel> *)(uVar3 + 0x60))->
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_78 = (String *)CONCAT44(local_78._4_4_,pVVar7->x);
  pVVar7 = ::gui::Panel::getSize
                     ((((shared_ptr<gui::Panel> *)(uVar3 + 0x60))->
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  x = local_78._0_4_ * 0.5;
  if (80.0 <= x) {
    x = 80.0;
  }
  y = pVVar7->y * 0.5;
  if (80.0 <= y) {
    y = 80.0;
  }
  ::gui::Widget::setPosition((Widget *)(local_70._0_8_ + 0x20),x,y);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  return;
}

Assistant:

void EditorInterface::showSaveDialog(const std::function<void()>& action) {
    modalBackground_->sendToFront();
    modalBackground_->setVisible(true);
    auto saveDialog = modalBackground_->getChild<gui::DialogBox>("saveDialog");
    auto saveDialogPtr = saveDialog.get();

    auto saveSubmitButton = saveDialog->getChild<gui::Button>("saveSubmitButton");
    saveSubmitButton->onClick.disconnectAll();
    saveSubmitButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        editor_.saveBoard();
        action();    // FIXME: the action runs immediately and doesn't give gui time to update, do we want to run this in a Timer instance instead? Could that cause issues? (someone clears the timers, or we happen to run that in a different thread)
    });

    auto saveRefuseButton = saveDialog->getChild<gui::Button>("saveRefuseButton");
    saveRefuseButton->onClick.disconnectAll();
    saveRefuseButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        action();
    });

    saveDialog->setVisible(true);
    saveDialog->setPosition(
        std::min(80.0f, modalBackground_->getSize().x / 2.0f),
        std::min(80.0f, modalBackground_->getSize().y / 2.0f)
    );
}